

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O3

void Aig_ManPrintStats(Aig_Man_t *p)

{
  uint uVar1;
  
  uVar1 = Aig_ManChoiceNum(p);
  printf("%-15s : ",p->pName);
  printf("pi = %5d  ",(ulong)(uint)(p->nObjs[2] - p->nRegs));
  printf("po = %5d  ",(ulong)(uint)(p->nObjs[3] - p->nRegs));
  if (p->nRegs != 0) {
    printf("lat = %5d  ");
  }
  printf("and = %7d  ",(ulong)(uint)p->nObjs[5]);
  if (p->nObjs[6] != 0) {
    printf("xor = %5d  ");
  }
  if (uVar1 != 0) {
    printf("ch = %5d  ",(ulong)uVar1);
  }
  if (p->nObjs[4] != 0) {
    printf("buf = %5d  ");
  }
  uVar1 = Aig_ManLevels(p);
  printf("lev = %3d",(ulong)uVar1);
  putchar(10);
  fflush(_stdout);
}

Assistant:

void Aig_ManPrintStats( Aig_Man_t * p )
{
    int nChoices = Aig_ManChoiceNum(p);
    printf( "%-15s : ",      p->pName );
    printf( "pi = %5d  ",    Aig_ManCiNum(p)-Aig_ManRegNum(p) );
    printf( "po = %5d  ",    Aig_ManCoNum(p)-Aig_ManRegNum(p) );
    if ( Aig_ManRegNum(p) )
    printf( "lat = %5d  ", Aig_ManRegNum(p) );
    printf( "and = %7d  ",   Aig_ManAndNum(p) );
//    printf( "Eq = %7d  ",     Aig_ManHaigCounter(p) );
    if ( Aig_ManExorNum(p) )
    printf( "xor = %5d  ",    Aig_ManExorNum(p) );
    if ( nChoices )
    printf( "ch = %5d  ",  nChoices );
    if ( Aig_ManBufNum(p) )
    printf( "buf = %5d  ",    Aig_ManBufNum(p) );
//    printf( "Cre = %6d  ",  p->nCreated );
//    printf( "Del = %6d  ",  p->nDeleted );
//    printf( "Lev = %3d  ",  Aig_ManLevelNum(p) );
//    printf( "Max = %7d  ",  Aig_ManObjNumMax(p) );
    printf( "lev = %3d",  Aig_ManLevels(p) );
    printf( "\n" );
    fflush( stdout );
}